

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

char * CVodeGetReturnFlagName(long flag)

{
  char *__s;
  undefined8 in_RDI;
  char *name;
  
  __s = (char *)malloc(0x18);
  switch(in_RDI) {
  case 0:
    sprintf(__s,"CV_SUCCESS");
    break;
  case 1:
    sprintf(__s,"CV_TSTOP_RETURN");
    break;
  case 2:
    sprintf(__s,"CV_ROOT_RETURN");
    break;
  case 0xffffffffffffffe1:
    sprintf(__s,"CV_REPTD_PROJFUNC_ERR");
    break;
  case 0xffffffffffffffe2:
    sprintf(__s,"CV_PROJFUNC_FAIL");
    break;
  case 0xffffffffffffffe3:
    sprintf(__s,"CV_PROJ_MEM_NULL");
    break;
  default:
    sprintf(__s,"NONE");
    break;
  case 0xffffffffffffffe5:
    sprintf(__s,"CV_TOO_CLOSE");
    break;
  case 0xffffffffffffffe6:
    sprintf(__s,"CV_BAD_DKY");
    break;
  case 0xffffffffffffffe7:
    sprintf(__s,"CV_BAD_T");
    break;
  case 0xffffffffffffffe8:
    sprintf(__s,"CV_BAD_K");
    break;
  case 0xffffffffffffffe9:
    sprintf(__s,"CV_NO_MALLOC");
    break;
  case 0xffffffffffffffea:
    sprintf(__s,"CV_ILL_INPUT");
    break;
  case 0xffffffffffffffeb:
    sprintf(__s,"CV_MEM_NULL");
    break;
  case 0xffffffffffffffec:
    sprintf(__s,"CV_MEM_FAIL");
    break;
  case 0xfffffffffffffff0:
    sprintf(__s,"CV_NLS_FAIL");
    break;
  case 0xfffffffffffffff2:
    sprintf(__s,"CV_NLS_SETUPT_FAIL");
    break;
  case 0xfffffffffffffff3:
    sprintf(__s,"CV_NLS_INIT_FAIL");
    break;
  case 0xfffffffffffffff4:
    sprintf(__s,"CV_RTFUNC_FAIL");
    break;
  case 0xfffffffffffffff5:
    sprintf(__s,"CV_UNREC_RHSFUNC_ERR");
    break;
  case 0xfffffffffffffff6:
    sprintf(__s,"CV_REPTD_RHSFUNC_ERR");
    break;
  case 0xfffffffffffffff7:
    sprintf(__s,"CV_FIRST_RHSFUNC_ERR");
    break;
  case 0xfffffffffffffff8:
    sprintf(__s,"CV_RHSFUNC_FAIL");
    break;
  case 0xfffffffffffffff9:
    sprintf(__s,"CV_LSOLVE_FAIL");
    break;
  case 0xfffffffffffffffa:
    sprintf(__s,"CV_LSETUP_FAIL");
    break;
  case 0xfffffffffffffffb:
    sprintf(__s,"CV_LINIT_FAIL");
    break;
  case 0xfffffffffffffffc:
    sprintf(__s,"CV_CONV_FAILURE");
    break;
  case 0xfffffffffffffffd:
    sprintf(__s,"CV_ERR_FAILURE");
    break;
  case 0xfffffffffffffffe:
    sprintf(__s,"CV_TOO_MUCH_ACC");
    break;
  case 0xffffffffffffffff:
    sprintf(__s,"CV_TOO_MUCH_WORK");
  }
  return __s;
}

Assistant:

char *CVodeGetReturnFlagName(long int flag)
{
  char *name;

  name = (char *)malloc(24*sizeof(char));

  switch(flag) {
  case CV_SUCCESS:
    sprintf(name,"CV_SUCCESS");
    break;
  case CV_TSTOP_RETURN:
    sprintf(name,"CV_TSTOP_RETURN");
    break;
  case CV_ROOT_RETURN:
    sprintf(name,"CV_ROOT_RETURN");
    break;
  case CV_TOO_MUCH_WORK:
    sprintf(name,"CV_TOO_MUCH_WORK");
    break;
  case CV_TOO_MUCH_ACC:
    sprintf(name,"CV_TOO_MUCH_ACC");
    break;
  case CV_ERR_FAILURE:
    sprintf(name,"CV_ERR_FAILURE");
    break;
  case CV_CONV_FAILURE:
    sprintf(name,"CV_CONV_FAILURE");
    break;
  case CV_LINIT_FAIL:
    sprintf(name,"CV_LINIT_FAIL");
    break;
  case CV_LSETUP_FAIL:
    sprintf(name,"CV_LSETUP_FAIL");
    break;
  case CV_LSOLVE_FAIL:
    sprintf(name,"CV_LSOLVE_FAIL");
    break;
  case CV_RHSFUNC_FAIL:
    sprintf(name,"CV_RHSFUNC_FAIL");
    break;
  case CV_FIRST_RHSFUNC_ERR:
    sprintf(name,"CV_FIRST_RHSFUNC_ERR");
    break;
  case CV_REPTD_RHSFUNC_ERR:
    sprintf(name,"CV_REPTD_RHSFUNC_ERR");
    break;
  case CV_UNREC_RHSFUNC_ERR:
    sprintf(name,"CV_UNREC_RHSFUNC_ERR");
    break;
  case CV_RTFUNC_FAIL:
    sprintf(name,"CV_RTFUNC_FAIL");
    break;
  case CV_MEM_FAIL:
    sprintf(name,"CV_MEM_FAIL");
    break;
  case CV_MEM_NULL:
    sprintf(name,"CV_MEM_NULL");
    break;
  case CV_ILL_INPUT:
    sprintf(name,"CV_ILL_INPUT");
    break;
  case CV_NO_MALLOC:
    sprintf(name,"CV_NO_MALLOC");
    break;
  case CV_BAD_K:
    sprintf(name,"CV_BAD_K");
    break;
  case CV_BAD_T:
    sprintf(name,"CV_BAD_T");
    break;
  case CV_BAD_DKY:
    sprintf(name,"CV_BAD_DKY");
    break;
  case CV_TOO_CLOSE:
    sprintf(name,"CV_TOO_CLOSE");
    break;
  case CV_NLS_INIT_FAIL:
    sprintf(name,"CV_NLS_INIT_FAIL");
    break;
  case CV_NLS_SETUP_FAIL:
    sprintf(name,"CV_NLS_SETUPT_FAIL");
    break;
  case CV_NLS_FAIL:
    sprintf(name,"CV_NLS_FAIL");
    break;
  case CV_PROJ_MEM_NULL:
    sprintf(name,"CV_PROJ_MEM_NULL");
    break;
  case CV_PROJFUNC_FAIL:
    sprintf(name,"CV_PROJFUNC_FAIL");
    break;
  case CV_REPTD_PROJFUNC_ERR:
    sprintf(name,"CV_REPTD_PROJFUNC_ERR");
    break;
  default:
    sprintf(name,"NONE");
  }

  return(name);
}